

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atakebune.cpp
# Opt level: O3

void __thiscall Atakebune::Atakebune(Atakebune *this,string *n,int t,int spT)

{
  pointer pcVar1;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar1,pcVar1 + n->_M_string_length)
  ;
  std::operator+(&local_70,"Green Card - Follower. Atakebune: ",n);
  Follower::Follower(&this->super_Follower,&local_90,t,spT,3,2,4,3,3,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (this->super_Follower).super_GreenCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00118798;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 3;
  this->tapped = false;
  this->attackBonus = 2;
  this->defenseBonus = 4;
  this->minimumHonor = 3;
  this->effectBonus = 3;
  this->effectCost = 4;
  std::operator+(&local_50,"Green Card - Follower. Atakebune: ",&this->name);
  std::__cxx11::string::operator=((string *)&this->cardText,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Atakebune::Atakebune(string n, int t, int spT) : Follower{n, t, spT, 3, 2, 4, 3, 3, 4, "Green Card - Follower. Atakebune: "+ n}
{
    name = n;
    cost = 3;
    tapped = false;

    attackBonus = 2;
    defenseBonus = 4;
    minimumHonor = 3;
    effectBonus = 3;
    effectCost = 4;
    cardText = "Green Card - Follower. Atakebune: " + name;
}